

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall ClassReg::SetupClass(ClassReg *this,PClass *cls)

{
  FName local_1c;
  PClass *local_18;
  PClass *cls_local;
  ClassReg *this_local;
  
  local_18 = cls;
  cls_local = (PClass *)this;
  if (this->MyClass == (PClass *)0x0) {
    this->MyClass = cls;
    FName::FName(&local_1c,this->Name + 1);
    FName::operator=(&(local_18->super_PStruct).super_PNamedType.TypeName,&local_1c);
    *(uint *)&(local_18->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
              super_DObject.field_0x24 = *(uint *)&this->field_0x28 & 0xfffffff;
    local_18->Pointers = this->Pointers;
    local_18->ConstructNative = this->ConstructNative;
    return;
  }
  __assert_fail("MyClass == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xbe7,"void ClassReg::SetupClass(PClass *)");
}

Assistant:

void ClassReg::SetupClass(PClass *cls)
{
	assert(MyClass == NULL);
	MyClass = cls;
	cls->TypeName = FName(Name+1);
	cls->Size = SizeOf;
	cls->Pointers = Pointers;
	cls->ConstructNative = ConstructNative;
}